

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utf8Codex.cpp
# Opt level: O3

size_t utf8::DecodeUnitsInto
                 (char16 *buffer,LPCUTF8 *pbUtf8,LPCUTF8 pbEnd,DecodeOptions options,
                 bool *chunkEndsAtTruncatedSequence)

{
  byte bVar1;
  uint uVar2;
  char16 cVar3;
  uint *puVar4;
  uint *puVar5;
  long lVar6;
  char16 *pcVar7;
  undefined1 in_XMM0 [16];
  undefined1 extraout_XMM0 [16];
  undefined1 in_XMM1 [16];
  uint *local_50;
  uint *local_48;
  char16 *local_40;
  DecodeOptions local_34 [2];
  DecodeOptions localOptions;
  
  if (chunkEndsAtTruncatedSequence != (bool *)0x0) {
    *chunkEndsAtTruncatedSequence = false;
  }
  local_50 = (uint *)*pbUtf8;
  local_48 = (uint *)pbEnd;
  local_40 = buffer;
  local_34[0] = options;
  if ((((uint)local_50 | (uint)buffer) & 3) != 0) goto LAB_0068c823;
  do {
    if ((uint *)((long)local_50 + 3U) < pbEnd) {
      in_XMM0 = pmovsxbd(in_XMM0,0x7f7f7f7f);
      in_XMM1 = pmovsxbw(in_XMM1,0x7f007f007f007f00);
      puVar4 = local_50;
      do {
        uVar2 = *puVar4;
        local_50 = puVar4;
        if ((uVar2 & 0x80808080) != 0) break;
        *(ulong *)buffer =
             CONCAT44((uVar2 >> 0x10) << 8,uVar2 << 8) & in_XMM1._0_8_ |
             CONCAT44(uVar2 >> 0x10,uVar2) & in_XMM0._0_8_;
        local_50 = puVar4 + 1;
        buffer = buffer + 4;
        puVar5 = (uint *)((long)puVar4 + 7);
        puVar4 = local_50;
      } while (puVar5 < pbEnd);
    }
LAB_0068c823:
    lVar6 = (long)buffer - (long)local_40;
    puVar4 = local_50;
    pcVar7 = buffer;
    do {
      pcVar7 = pcVar7 + 1;
      local_50 = puVar4;
      if (pbEnd <= puVar4) {
LAB_0068c88e:
        *pbUtf8 = (LPCUTF8)local_50;
        return lVar6 >> 1;
      }
      local_50 = (uint *)((long)puVar4 + 1);
      bVar1 = (byte)*puVar4;
      cVar3 = (char16)bVar1;
      if ((char)bVar1 < '\0') {
        cVar3 = DecodeTail((ushort)bVar1,(LPCUTF8 *)&local_50,(LPCUTF8)local_48,local_34,
                           chunkEndsAtTruncatedSequence);
        pbEnd = (LPCUTF8)local_48;
        in_XMM0 = extraout_XMM0;
      }
      if (local_50 <= puVar4) goto LAB_0068c88e;
      *buffer = cVar3;
      buffer = buffer + 1;
      lVar6 = lVar6 + 2;
      puVar4 = local_50;
    } while ((((uint)local_50 | (uint)pcVar7) & 3) != 0);
  } while( true );
}

Assistant:

_Use_decl_annotations_
    size_t DecodeUnitsInto(char16 *buffer, LPCUTF8& pbUtf8, LPCUTF8 pbEnd, DecodeOptions options, bool *chunkEndsAtTruncatedSequence)
    {
        DecodeOptions localOptions = options;

        if (chunkEndsAtTruncatedSequence)
        {
            *chunkEndsAtTruncatedSequence = false;
        }

        LPCUTF8 p = pbUtf8;
        char16 *dest = buffer;

        if (!ShouldFastPath(p, dest)) goto LSlowPath;

LFastPath:
        while (p + 3 < pbEnd)
        {
            unsigned bytes = *(unsigned *)p;
            if ((bytes & 0x80808080) != 0) goto LSlowPath;
            ((uint32 *)dest)[0] = (char16(bytes) & 0x00FF) | ((char16(bytes) & 0xFF00) << 8);
            ((uint32 *)dest)[1] = (char16(bytes >> 16) & 0x00FF) | ((char16(bytes >> 16) & 0xFF00) << 8);
            p += 4;
            dest += 4;
        }

LSlowPath:
        while (p < pbEnd)
        {
            LPCUTF8 s = p;
            char16 chDest = Decode(p, pbEnd, localOptions, chunkEndsAtTruncatedSequence);

            if (s < p)
            {
                // We decoded the character, store it
                *dest++ = chDest;
            }
            else
            {
                // Nothing was converted. This might happen at the end of a buffer with doChunkedEncoding.
                break;
            }

            if (ShouldFastPath(p, dest)) goto LFastPath;
        }

        pbUtf8 = p;

        return dest - buffer;
    }